

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O2

void __thiscall embree::Image::convertToRGBA8(Image *this,uchar *dest)

{
  ulong uVar1;
  char cVar2;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  undefined1 auVar10 [16];
  undefined6 uVar11;
  undefined8 uVar12;
  unkbyte10 Var13;
  undefined1 auVar14 [12];
  undefined1 auVar15 [14];
  short sVar16;
  undefined4 uVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  size_t x;
  ulong uVar22;
  size_t y;
  ulong uVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  Color4 c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  char cVar3;
  char cVar4;
  char cVar5;
  
  for (uVar23 = 0; uVar23 < this->height; uVar23 = uVar23 + 1) {
    for (uVar22 = 0; uVar1 = this->width, uVar22 < uVar1; uVar22 = uVar22 + 1) {
      (*(this->super_RefCount)._vptr_RefCount[4])(&local_48,this,uVar22,uVar23);
      iVar18 = (int)(local_48 * 255.0);
      iVar19 = (int)(fStack_44 * 255.0);
      cVar24 = (char)((uint)iVar19 >> 0x10);
      iVar20 = (int)(fStack_40 * 255.0);
      cVar25 = (char)((uint)iVar20 >> 0x10);
      iVar21 = (int)(fStack_3c * 255.0);
      cVar26 = (char)((uint)iVar21 >> 0x10);
      uVar11 = CONCAT15((char)((uint)iVar19 >> 8),CONCAT14((char)iVar19,iVar18));
      uVar12 = CONCAT17((char)((uint)iVar19 >> 0x18),CONCAT16(cVar24,uVar11));
      Var13 = CONCAT19((char)((uint)iVar20 >> 8),CONCAT18((char)iVar20,uVar12));
      auVar14[10] = cVar25;
      auVar14._0_10_ = Var13;
      auVar14[0xb] = (char)((uint)iVar20 >> 0x18);
      auVar15[0xc] = (char)iVar21;
      auVar15._0_12_ = auVar14;
      auVar15[0xd] = (char)((uint)iVar21 >> 8);
      auVar10[0xe] = cVar26;
      auVar10._0_14_ = auVar15;
      auVar10[0xf] = (char)((uint)iVar21 >> 0x18);
      sVar6 = (short)iVar18;
      cVar2 = (0 < sVar6) * (sVar6 < 0x100) * (char)iVar18 - (0xff < sVar6);
      sVar6 = (short)((uint)iVar18 >> 0x10);
      sVar7 = (short)((uint6)uVar11 >> 0x20);
      cVar3 = (0 < sVar7) * (sVar7 < 0x100) * (char)iVar19 - (0xff < sVar7);
      sVar7 = (short)((ulong)uVar12 >> 0x30);
      sVar8 = (short)((unkuint10)Var13 >> 0x40);
      cVar4 = (0 < sVar8) * (sVar8 < 0x100) * (char)iVar20 - (0xff < sVar8);
      sVar8 = auVar14._10_2_;
      sVar9 = auVar15._12_2_;
      cVar5 = (0 < sVar9) * (sVar9 < 0x100) * (char)iVar21 - (0xff < sVar9);
      sVar9 = auVar10._14_2_;
      sVar16 = CONCAT11((0 < sVar6) * (sVar6 < 0x100) * (char)((uint)iVar18 >> 0x10) -
                        (0xff < sVar6),cVar2);
      uVar17 = CONCAT13((0 < sVar7) * (sVar7 < 0x100) * cVar24 - (0xff < sVar7),
                        CONCAT12(cVar3,sVar16));
      uVar11 = CONCAT15((0 < sVar8) * (sVar8 < 0x100) * cVar25 - (0xff < sVar8),
                        CONCAT14(cVar4,uVar17));
      sVar6 = (short)((uint)uVar17 >> 0x10);
      sVar7 = (short)((uint6)uVar11 >> 0x20);
      sVar8 = (short)(CONCAT17((0 < sVar9) * (sVar9 < 0x100) * cVar26 - (0xff < sVar9),
                               CONCAT16(cVar5,uVar11)) >> 0x30);
      *(uint *)(dest + (uVar1 * uVar23 + uVar22) * 4) =
           CONCAT13((0 < sVar8) * (sVar8 < 0x100) * cVar5 - (0xff < sVar8),
                    CONCAT12((0 < sVar7) * (sVar7 < 0x100) * cVar4 - (0xff < sVar7),
                             CONCAT11((0 < sVar6) * (sVar6 < 0x100) * cVar3 - (0xff < sVar6),
                                      (0 < sVar16) * (sVar16 < 0x100) * cVar2 - (0xff < sVar16))));
    }
  }
  return;
}

Assistant:

void convertToRGBA8(unsigned char *dest)
    {
      for (size_t y=0;y<height;y++)
	for (size_t x=0;x<width;x++)
	  {
	    size_t offset = 4 * (y * width + x);
	    Color4 c = get(x,y);
	    dest[offset+0] = (unsigned char)(c.r * 255.0f);
	    dest[offset+1] = (unsigned char)(c.g * 255.0f);
	    dest[offset+2] = (unsigned char)(c.b * 255.0f);
	    dest[offset+3] = (unsigned char)(c.a * 255.0f);
	  }
    }